

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

uint64 __thiscall google::protobuf::internal::ArenaImpl::Reset(ArenaImpl *this)

{
  uint64 uVar1;
  __pointer_type this_00;
  
  for (this_00 = (this->threads_)._M_b._M_p; this_00 != (SerialArena *)0x0; this_00 = this_00->next_
      ) {
    if (this_00->cleanup_ != (CleanupChunk *)0x0) {
      SerialArena::CleanupListFallback(this_00);
    }
  }
  uVar1 = FreeBlocks(this);
  Init(this);
  return uVar1;
}

Assistant:

uint64 ArenaImpl::Reset() {
  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();
  uint64 space_allocated = FreeBlocks();
  Init();

  return space_allocated;
}